

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseRect(LEFReader *this)

{
  string *tokstr;
  token_t tVar1;
  bool bVar2;
  int iVar3;
  string coords;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  tokstr = &this->m_tokstr;
  iVar3 = 4;
  local_50 = &local_40;
  do {
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    if (tVar1 != TOK_NUMBER) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Expected number in RECT\n","");
      error(this,&local_70);
      goto LAB_0012d961;
    }
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)(this->m_tokstr)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_50);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  tVar1 = tokenize(this,tokstr);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_SEMICOL) {
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    bVar2 = true;
    if (tVar1 == TOK_EOL) goto LAB_0012d97a;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected an EOL in RECT\n","");
    error(this,&local_70);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected a semicolon in RECT\n","");
    error(this,&local_70);
  }
LAB_0012d961:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0012d97a:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return bVar2;
}

Assistant:

bool LEFReader::parseRect()
{
    
    std::string coords;

    for(uint32_t i=0; i<4; i++)
    {
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_NUMBER)
        {
            error("Expected number in RECT\n");
            return false;
        }
        coords += m_tokstr;
        coords += " ";
    }

    // expect ; 
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon in RECT\n");
        return false;
    }

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected an EOL in RECT\n");
        return false;
    }    

    //std::cout << "      RECT " << coords << "\n";

    return true;
}